

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookmempool.h
# Opt level: O0

void __thiscall
cookmem::MemPool<cookmem::MmapArena,_cookmem::NoActionMemLogger,_void>::setUsed
          (MemPool<cookmem::MmapArena,_cookmem::NoActionMemLogger,_void> *this,MemChunk *chunk,
          size_type userSize)

{
  size_type sVar1;
  int local_38;
  char local_31;
  int i;
  char diff;
  char *paddingPtr;
  size_type chunkSize;
  size_type userSize_local;
  MemChunk *chunk_local;
  MemPool<cookmem::MmapArena,_cookmem::NoActionMemLogger,_void> *this_local;
  
  MemChunk::setUsedSize(chunk,(bool)(this->m_storingExactSize & 1),userSize);
  if ((this->m_padding & 1U) != 0) {
    sVar1 = MemChunk::getChunkSize(chunk);
    local_31 = ((char)sVar1 - (char)userSize) + -0x11;
    if ('\b' < local_31) {
      local_31 = '\b';
    }
    for (local_38 = 0; local_38 < local_31; local_38 = local_38 + 1) {
      *(char *)((long)&chunk[1].m_prevFootSize + (long)local_38 + userSize) = this->m_paddingByte;
    }
  }
  return;
}

Assistant:

inline void
    setUsed (MemChunk* chunk, size_type userSize)
    {
        chunk->setUsedSize (m_storingExactSize, userSize);

        // if we are padding, userSize will always be smaller
        // than the chunkSize
        if (m_padding)
        {
            size_type   chunkSize = chunk->getChunkSize ();
            char*       paddingPtr = ((char*)chunk) + userSize + CHUNK_OVERHEAD;
            char        diff = (char)(chunkSize - CHUNK_OVERHEAD - userSize - 1);
            if (diff > 8)
            {
                diff = 8;
            }
            for (int i = 0; i < diff; ++i)
            {
                paddingPtr[i] = m_paddingByte;
            }
        }
    }